

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_130 [8];
  sigset_t sw;
  sigset_t all;
  epoll_event ev;
  int sc;
  int opt;
  int n;
  char **argv_local;
  int argc_local;
  
  cfg.prog = *argv;
  cfg.pid = getpid();
  while (iVar2 = getopt(argc,argv,"vp:a:h"), iVar2 != -1) {
    switch(iVar2) {
    case 0x61:
      cfg.addr = inet_addr(_optarg);
      break;
    case 0x68:
    default:
      usage();
      break;
    case 0x70:
      cfg.port = atoi(_optarg);
      break;
    case 0x76:
      cfg.verbose = cfg.verbose + 1;
    }
  }
  if (cfg.addr == 0xffffffff) {
    usage();
  }
  if (cfg.port == 0) {
    usage();
  }
  cfg.subprocess_argv = argv + _optind;
  cfg.subprocess_argc = argc - _optind;
  if (cfg.verbose != 0) {
    for (sc = 0; sc < cfg.subprocess_argc; sc = sc + 1) {
      fprintf(_stderr,"subprocess: argv[%d]: %s\n",(ulong)(uint)sc,cfg.subprocess_argv[sc]);
    }
  }
  sigfillset((sigset_t *)(sw.__val + 0xf));
  sigprocmask(2,(sigset_t *)(sw.__val + 0xf),(sigset_t *)0x0);
  sigemptyset((sigset_t *)local_130);
  for (sc = 0; (uint)sc < 7; sc = sc + 1) {
    sigaddset((sigset_t *)local_130,sigs[sc]);
  }
  iVar2 = setup_listener();
  if (iVar2 == 0) {
    cfg.signal_fd = signalfd(-1,(sigset_t *)local_130,0);
    pFVar1 = _stderr;
    if (cfg.signal_fd == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"signalfd: %s\n",pcVar4);
    }
    else {
      cfg.epoll_fd = epoll_create(1);
      pFVar1 = _stderr;
      if (cfg.epoll_fd == -1) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"epoll: %s\n",pcVar4);
      }
      else {
        iVar2 = add_epoll(1,cfg.listener_fd);
        if ((iVar2 == 0) && (iVar2 = add_epoll(1,cfg.signal_fd), iVar2 == 0)) {
          alarm(1);
          do {
            while( true ) {
              iVar2 = epoll_wait(cfg.epoll_fd,(epoll_event *)(all.__val + 0xf),1,-1);
              pFVar1 = _stderr;
              if (iVar2 < 1) {
                piVar3 = __errno_location();
                pcVar4 = strerror(*piVar3);
                fprintf(pFVar1,"epoll_wait: %s\n",pcVar4);
                goto LAB_00101e07;
              }
              if (all.__val[0xf]._4_4_ != cfg.signal_fd) break;
              iVar2 = handle_signal();
              if (iVar2 < 0) goto LAB_00101e07;
            }
            if (all.__val[0xf]._4_4_ != cfg.listener_fd) {
              fprintf(_stderr,"Unexpected file descriptor from epoll\n");
              break;
            }
            iVar2 = accept_client();
          } while (-1 < iVar2);
        }
      }
    }
  }
LAB_00101e07:
  if (cfg.listener_fd != -1) {
    close(cfg.listener_fd);
  }
  if (cfg.epoll_fd != -1) {
    close(cfg.epoll_fd);
  }
  if (cfg.signal_fd != -1) {
    close(cfg.signal_fd);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  cfg.prog = argv[0];
  cfg.prog=argv[0];
  cfg.pid = getpid();
  int n, opt, sc;
  struct epoll_event ev;

  while ( (opt=getopt(argc,argv,"vp:a:h")) != -1) {
    switch(opt) {
      case 'v': cfg.verbose++; break;
      case 'p': cfg.port=atoi(optarg); break; 
      case 'a': cfg.addr=inet_addr(optarg); break; 
      case 'h': default: usage(); break;
    }
  }
  if (cfg.addr == INADDR_NONE) usage();
  if (cfg.port==0) usage();
  /* advance argv/argc to subprocess name and arguments */
  cfg.subprocess_argv = argv + optind;
  cfg.subprocess_argc = argc - optind;
  if (cfg.verbose) {
    for(n = 0; n < cfg.subprocess_argc; n++) {
      fprintf(stderr, "subprocess: argv[%d]: %s\n", n, cfg.subprocess_argv[n]);
    }
  }

  /* block all signals. we take signals synchronously via signalfd */
  sigset_t all;
  sigfillset(&all);
  sigprocmask(SIG_SETMASK,&all,NULL);

  /* a few signals we'll accept via our signalfd */
  sigset_t sw;
  sigemptyset(&sw);
  for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) sigaddset(&sw, sigs[n]);

  if (setup_listener()) goto done;

  /* create the signalfd for receiving signals */
  cfg.signal_fd = signalfd(-1, &sw, 0);
  if (cfg.signal_fd == -1) {
    fprintf(stderr,"signalfd: %s\n", strerror(errno));
    goto done;
  }

  /* set up the epoll instance */
  cfg.epoll_fd = epoll_create(1); 
  if (cfg.epoll_fd == -1) {
    fprintf(stderr,"epoll: %s\n", strerror(errno));
    goto done;
  }

  /* add descriptors of interest */
  if (add_epoll(EPOLLIN, cfg.listener_fd)) goto done;
  if (add_epoll(EPOLLIN, cfg.signal_fd)) goto done;

  /*
   * This is our main loop. epoll for input or signals.
   */
  alarm(1);
  while (epoll_wait(cfg.epoll_fd, &ev, 1, -1) > 0) {

    if (ev.data.fd == cfg.signal_fd) { 
      sc = handle_signal();
      if (sc < 0) goto done;
    }
    else if (ev.data.fd == cfg.listener_fd) { 
      sc = accept_client();
      if (sc < 0) goto done;
    }
    else {
      fprintf(stderr, "Unexpected file descriptor from epoll\n");
      goto done;
    }
  }

  fprintf(stderr, "epoll_wait: %s\n", strerror(errno));

 done:   /* we get here if we got a signal like Ctrl-C */
  if (cfg.listener_fd != -1) close(cfg.listener_fd);
  if (cfg.epoll_fd != -1) close(cfg.epoll_fd);
  if (cfg.signal_fd != -1) close(cfg.signal_fd);
  return 0;
}